

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O3

void TestTamperedSig(API api,uint8_t *digest,size_t digest_len,ECDSA_SIG *ecdsa_sig,EC_KEY *eckey,
                    BIGNUM *order)

{
  byte *pbVar1;
  size_type __n;
  uint uVar2;
  int iVar3;
  BIGNUM *pBVar4;
  ulong uVar5;
  byte bVar6;
  char *pcVar7;
  pointer *__ptr;
  ScopedTrace gtest_trace_110;
  size_t bn_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_buf;
  size_t s_len;
  size_t r_len;
  AssertHelper AStack_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  ScopedTrace local_91;
  AssertHelper local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ulong local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  API local_3c;
  ulong local_38;
  ulong local_30;
  
  local_3c = api;
  testing::ScopedTrace::ScopedTrace<API>
            (&local_91,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
             ,0x6e,&local_3c);
  uVar2 = BN_num_bytes(*(BIGNUM **)digest_len);
  local_30 = (ulong)uVar2;
  uVar2 = BN_num_bytes(*(BIGNUM **)(digest_len + 8));
  local_38 = (ulong)uVar2;
  uVar2 = BN_num_bytes((BIGNUM *)eckey);
  local_60 = (ulong)uVar2;
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)local_80,"r_len","bn_len",&local_30,&local_60);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x77,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_58);
  }
  else {
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_80,"s_len","bn_len",&local_38,&local_60);
    if (local_80[0] != (internal)0x0) {
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      __n = local_60 * 2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_58,__n,(allocator_type *)local_80);
      iVar3 = BN_bn2bin_padded(local_58.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,local_60,
                               *(BIGNUM **)digest_len);
      local_90.data_._0_1_ = (internal)(iVar3 != 0);
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)&local_90,
                   (AssertionResult *)"BN_bn2bin_padded(raw_buf.data(), bn_len, ecdsa_sig->r)",
                   "false","true",(char *)order);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                   ,0x7c,(char *)CONCAT71(local_80._1_7_,local_80[0]));
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
LAB_002f1980:
        testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1
                         );
        }
        if (local_a0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
      }
      else {
        iVar3 = BN_bn2bin_padded((uint8_t *)
                                 ((long)local_58.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start + local_60),
                                 local_60,*(BIGNUM **)(digest_len + 8));
        local_90.data_._0_1_ = (internal)(iVar3 != 0);
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_80,(internal *)&local_90,
                     (AssertionResult *)
                     "BN_bn2bin_padded(raw_buf.data() + bn_len, bn_len, ecdsa_sig->s)","false",
                     "true",(char *)order);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0x7d,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
          goto LAB_002f1980;
        }
        uVar5 = (ulong)*(byte *)((long)local_58.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 10) % __n;
        bVar6 = *(char *)((long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 0xb) +
                (*(char *)((long)local_58.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0xb) == '\0');
        pbVar1 = (byte *)((long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar5);
        *pbVar1 = *pbVar1 ^ bVar6;
        pBVar4 = BN_bin2bn(local_58.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(int)local_60,*(BIGNUM **)digest_len);
        local_90.data_._0_1_ = (internal)(pBVar4 != (BIGNUM *)0x0);
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (pBVar4 == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_80,(internal *)&local_90,
                     (AssertionResult *)"BN_bin2bn(raw_buf.data(), bn_len, ecdsa_sig->r)","false",
                     "true",(char *)order);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0x84,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
          goto LAB_002f1980;
        }
        pBVar4 = BN_bin2bn((uchar *)((long)local_58.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + local_60),
                           (int)local_60,*(BIGNUM **)(digest_len + 8));
        local_90.data_._0_1_ = (internal)(pBVar4 != (BIGNUM *)0x0);
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (pBVar4 == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_80,(internal *)&local_90,
                     (AssertionResult *)"BN_bin2bn(raw_buf.data() + bn_len, bn_len, ecdsa_sig->s)",
                     "false","true",(char *)order);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0x85,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
          goto LAB_002f1980;
        }
        VerifyECDSASig(local_3c,digest,digest_len,ecdsa_sig,(EC_KEY *)0x0,(int)order);
        pbVar1 = (byte *)((long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar5);
        *pbVar1 = *pbVar1 ^ bVar6;
        pBVar4 = BN_bin2bn(local_58.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(int)local_60,*(BIGNUM **)digest_len);
        local_90.data_._0_1_ = (internal)(pBVar4 != (BIGNUM *)0x0);
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (pBVar4 == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_80,(internal *)&local_90,
                     (AssertionResult *)"BN_bin2bn(raw_buf.data(), bn_len, ecdsa_sig->r)","false",
                     "true",(char *)order);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0x8a,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
          goto LAB_002f1980;
        }
        pBVar4 = BN_bin2bn((uchar *)((long)local_58.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + local_60),
                           (int)local_60,*(BIGNUM **)(digest_len + 8));
        local_90.data_._0_1_ = (internal)(pBVar4 != (BIGNUM *)0x0);
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (pBVar4 == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_80,(internal *)&local_90,
                     (AssertionResult *)"BN_bin2bn(raw_buf.data() + bn_len, bn_len, ecdsa_sig->s)",
                     "false","true",(char *)order);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0x8b,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
          goto LAB_002f1980;
        }
        VerifyECDSASig(local_3c,digest,digest_len,ecdsa_sig,(EC_KEY *)0x1,(int)order);
      }
      if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_002f19dc;
    }
    testing::Message::Message((Message *)&local_58);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x78,pcVar7);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_58);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    (**(code **)(*(long *)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
LAB_002f19dc:
  testing::ScopedTrace::~ScopedTrace(&local_91);
  return;
}

Assistant:

static void TestTamperedSig(API api, const uint8_t *digest,
                            size_t digest_len, ECDSA_SIG *ecdsa_sig,
                            EC_KEY *eckey, const BIGNUM *order) {
  SCOPED_TRACE(api);
  // Modify a single byte of the signature: to ensure we don't
  // garble the ASN1 structure, we read the raw signature and
  // modify a byte in one of the bignums directly.

  // Store the two BIGNUMs in raw_buf.
  size_t r_len = BN_num_bytes(ecdsa_sig->r);
  size_t s_len = BN_num_bytes(ecdsa_sig->s);
  size_t bn_len = BN_num_bytes(order);
  ASSERT_LE(r_len, bn_len);
  ASSERT_LE(s_len, bn_len);
  size_t buf_len = 2 * bn_len;
  std::vector<uint8_t> raw_buf(buf_len);
  // Pad the bignums with leading zeroes.
  ASSERT_TRUE(BN_bn2bin_padded(raw_buf.data(), bn_len, ecdsa_sig->r));
  ASSERT_TRUE(BN_bn2bin_padded(raw_buf.data() + bn_len, bn_len, ecdsa_sig->s));

  // Modify a single byte in the buffer.
  size_t offset = raw_buf[10] % buf_len;
  uint8_t dirt = raw_buf[11] ? raw_buf[11] : 1;
  raw_buf[offset] ^= dirt;
  // Now read the BIGNUMs back in from raw_buf.
  ASSERT_TRUE(BN_bin2bn(raw_buf.data(), bn_len, ecdsa_sig->r));
  ASSERT_TRUE(BN_bin2bn(raw_buf.data() + bn_len, bn_len, ecdsa_sig->s));
  VerifyECDSASig(api, digest, digest_len, ecdsa_sig, eckey, 0);

  // Sanity check: Undo the modification and verify signature.
  raw_buf[offset] ^= dirt;
  ASSERT_TRUE(BN_bin2bn(raw_buf.data(), bn_len, ecdsa_sig->r));
  ASSERT_TRUE(BN_bin2bn(raw_buf.data() + bn_len, bn_len, ecdsa_sig->s));
  VerifyECDSASig(api, digest, digest_len, ecdsa_sig, eckey, 1);
}